

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GammaHandler.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
GammaHandler::combineSpectra
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,GammaHandler *this,
          double emin,double emax,string *source)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  pointer pdVar5;
  pointer pdVar6;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__x;
  RandomGen *pRVar7;
  GammaHandler *this_00;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  vector<double,_std::allocator<double>_> xyTry;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  sourceInfo;
  allocator_type local_a9;
  vector<double,_std::allocator<double>_> local_a8;
  double local_90;
  vector<double,_std::allocator<double>_> local_88;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  
  local_68 = emin;
  local_60 = emax;
  __x = sourceLookupTable((GammaHandler *)__return_storage_ptr__,source);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_48,__x);
  pRVar7 = RandomGen::rndm();
  dVar1 = RandomGen::rand_uniform(pRVar7);
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((local_60 - local_68) * dVar1 + local_68);
  local_90 = yMax;
  pRVar7 = RandomGen::rndm();
  dVar1 = RandomGen::rand_uniform(pRVar7);
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)(local_90 * dVar1);
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3ff0000000000000;
  this_00 = (GammaHandler *)&local_a8;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_88;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)this_00,__l,&local_a9);
  if (*(double *)
       ((long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + 0x10) <= 0.0) {
    bVar4 = false;
    bVar3 = false;
    bVar2 = false;
  }
  else {
    do {
      local_90 = photoIonization(this_00,&local_48,&local_a8);
      local_50 = compton(this_00,&local_48,&local_a8);
      local_58 = pairProduction(this_00,&local_48,&local_a8);
      pRVar7 = RandomGen::rndm();
      RandomGen::VonNeumann
                (&local_88,pRVar7,local_68,local_60,0.0,yMax,
                 *local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                 *(double *)
                  ((long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + 8),local_90 + local_50 + local_58);
      pdVar6 = local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      pdVar5 = local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if ((GammaHandler *)pdVar5 != (GammaHandler *)0x0) {
        operator_delete(pdVar5,(long)pdVar6 - (long)pdVar5);
      }
      this_00 = (GammaHandler *)
                local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((GammaHandler *)
          local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (GammaHandler *)0x0) {
        operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    } while (0.0 < *(double *)
                    ((long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start + 0x10));
    bVar2 = 0.0 < local_90;
    bVar3 = 0.0 < local_50;
    bVar4 = 0.0 < local_58;
  }
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xbff0000000000000;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xbff0000000000000;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0xbff0000000000000;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&local_88;
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,__l_00,&local_a9);
  if (bVar2) {
    *(__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
     super__Vector_impl_data._M_start =
         *local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start;
  }
  if (bVar3) {
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_start[1] =
         *local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start;
  }
  if (bVar4) {
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_start[2] =
         *local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start;
  }
  if ((GammaHandler *)
      local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (GammaHandler *)0x0) {
    operator_delete(local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_48);
  return __return_storage_ptr__;
}

Assistant:

const vector<double> GammaHandler::combineSpectra(double emin, double emax,
                                                  string source) {
  double brSum = 0.0;
  double fValue = 0.0;
  double pe = 0.0;
  double compton = 0.0;
  double pp = 0.0;

  vector<vector<double>> sourceInfo = GammaHandler::sourceLookupTable(source);

  vector<double> xyTry = {
      emin + (emax - emin) * RandomGen::rndm()->rand_uniform(),
      yMax * RandomGen::rndm()->rand_uniform(), 1.};

  while (xyTry[2] > 0.) {
    pe = GammaHandler::photoIonization(sourceInfo, xyTry);
    compton = GammaHandler::compton(sourceInfo, xyTry);
    pp = GammaHandler::pairProduction(sourceInfo, xyTry);
    fValue = pe + compton + pp;
    xyTry = RandomGen::rndm()->VonNeumann(emin, emax, 0., yMax, xyTry[0],
                                          xyTry[1], fValue);
  }

  vector<double> keV_vec = {-1, -1, -1};

  if (pe > 0.0) {
    keV_vec[0] = xyTry[0];
  }
  if (compton > 0.0) {
    keV_vec[1] = xyTry[0];
  }
  if (pp > 0.0) {
    keV_vec[2] = xyTry[0];
  }
  return keV_vec;
}